

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall Lexer::Append(Lexer *this,Lexeme *stream,uint count)

{
  uint uVar1;
  uint newSize;
  
  uVar1 = (this->lexems).count;
  newSize = uVar1 + count;
  if ((this->lexems).max <= newSize) {
    SmallArray<Lexeme,_32U>::grow(&this->lexems,newSize);
  }
  (this->lexems).count = newSize;
  memcpy((this->lexems).data + uVar1,stream,(ulong)count << 5);
  return;
}

Assistant:

void Lexer::Append(Lexeme* stream, unsigned count)
{
	unsigned oldSize = lexems.size();
	lexems.resize(lexems.size() + count);
	memcpy(&lexems.data[oldSize], stream, count * sizeof(Lexeme));
}